

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O3

void setup_des_key(uchar *key_56,DES_key_schedule *ks)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  uchar local_18;
  undefined4 local_17;
  byte local_13;
  byte local_12;
  uchar local_11;
  
  uVar1 = *(undefined4 *)key_56;
  uVar2 = *(undefined4 *)(key_56 + 1);
  uVar3 = CONCAT11((uchar)uVar1,(char)uVar2) * 0x80;
  uVar5 = CONCAT11((char)((uint)uVar1 >> 8),(char)((uint)uVar2 >> 8)) * 0x40;
  uVar7 = (short)(CONCAT15((char)((uint)uVar1 >> 0x10),CONCAT14((char)((uint)uVar2 >> 0x10),uVar2))
                 >> 0x20) * 0x20;
  uVar9 = CONCAT11((char)((uint)uVar1 >> 0x18),(char)((uint)uVar2 >> 0x18)) * 0x10;
  uVar4 = uVar3 >> 8;
  uVar6 = uVar5 >> 8;
  uVar8 = uVar7 >> 8;
  uVar10 = uVar9 >> 8;
  local_17._1_1_ = (uVar6 != 0) * (uVar6 < 0x100) * (char)(uVar5 >> 8) - (0xff < uVar6);
  local_17._0_1_ = (uVar4 != 0) * (uVar4 < 0x100) * (char)(uVar3 >> 8) - (0xff < uVar4);
  local_17._2_1_ = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar7 >> 8) - (0xff < uVar8);
  local_17._3_1_ = (uVar10 != 0) * (uVar10 < 0x100) * (char)(uVar9 >> 8) - (0xff < uVar10);
  local_18 = (uchar)uVar1;
  local_13 = key_56[5] >> 5 | key_56[4] << 3;
  local_12 = key_56[6] >> 6 | key_56[5] << 2;
  local_11 = key_56[6] * '\x02';
  DES_set_odd_parity((DES_cblock *)&local_18);
  DES_set_key_unchecked((const_DES_cblock *)&local_18,(DES_key_schedule *)ks);
  return;
}

Assistant:

static void setup_des_key(const unsigned char *key_56,
                          DES_key_schedule DESKEYARG(ks))
{
  DES_cblock key;

  /* Expand the 56-bit key to 64 bits */
  extend_key_56_to_64(key_56, (char *) &key);

  /* Set the key parity to odd */
  DES_set_odd_parity(&key);

  /* Set the key */
  DES_set_key_unchecked(&key, ks);
}